

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

void __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::InnerMap
::TransferTree(InnerMap *this,void **table,size_type index)

{
  Tree *tree;
  char *pcVar1;
  _Base_ptr p_Var2;
  char cVar3;
  long lVar4;
  iterator local_40;
  
  tree = (Tree *)table[index];
  p_Var2 = (tree->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    pcVar1 = ((*(Node **)(p_Var2 + 1))->kv).k_._M_dataplus._M_p;
    cVar3 = *pcVar1;
    if (cVar3 == '\0') {
      lVar4 = 0;
    }
    else {
      lVar4 = 0;
      do {
        pcVar1 = pcVar1 + 1;
        lVar4 = (long)cVar3 + lVar4 * 5;
        cVar3 = *pcVar1;
      } while (cVar3 != '\0');
    }
    InsertUnique(&local_40,this,this->num_buckets_ - 1 & (this->seed_ | 1) * lVar4,
                 *(Node **)(p_Var2 + 1));
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
  } while ((_Rb_tree_header *)p_Var2 != &(tree->_M_t)._M_impl.super__Rb_tree_header);
  DestroyTree(this,tree);
  return;
}

Assistant:

void TransferTree(void* const* table, size_type index) {
      Tree* tree = static_cast<Tree*>(table[index]);
      typename Tree::iterator tree_it = tree->begin();
      do {
        Node* node = NodePtrFromKeyPtr(*tree_it);
        InsertUnique(BucketNumber(**tree_it), node);
      } while (++tree_it != tree->end());
      DestroyTree(tree);
    }